

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O0

void __thiscall RangeLock_ErrorWithLockHeld_Test::TestBody(RangeLock_ErrorWithLockHeld_Test *this)

{
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *this_00;
  TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *this_01;
  MockSpec<void_(unsigned_long,_unsigned_long)> *this_02;
  TypedExpectation<void_(unsigned_long,_unsigned_long)> *this_03;
  custom_exception *this_04;
  custom_exception *anon_var_0;
  undefined1 local_570 [8];
  range_lock lock;
  size_t size;
  uint64_t offset;
  Matcher<unsigned_long> local_538;
  Matcher<unsigned_long> local_520;
  MockSpec<void_(unsigned_long,_unsigned_long)> local_508;
  ReturnAction<bool> local_4d0;
  Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  local_4c0;
  WithoutMatchers local_499;
  Matcher<pstore::file::file_base::blocking_mode> local_498;
  Matcher<pstore::file::file_base::lock_kind> local_480;
  Matcher<unsigned_long> local_468;
  Matcher<unsigned_long> local_440;
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  local_428;
  undefined1 local_3c0 [8];
  mock_file file;
  RangeLock_ErrorWithLockHeld_Test *this_local;
  
  file.gmock02_unlock_96.super_UntypedFunctionMockerBase.untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_16883::mock_file::mock_file((mock_file *)local_3c0);
  testing::Matcher<unsigned_long>::Matcher<testing::internal::AnythingMatcher_const&,void>
            (&local_440,(AnythingMatcher *)&testing::_);
  testing::Matcher<unsigned_long>::Matcher<testing::internal::AnythingMatcher_const&,void>
            (&local_468,(AnythingMatcher *)&testing::_);
  testing::Matcher<pstore::file::file_base::lock_kind>::
  Matcher<testing::internal::AnythingMatcher_const&,void>(&local_480,(AnythingMatcher *)&testing::_)
  ;
  testing::Matcher<pstore::file::file_base::blocking_mode>::
  Matcher<testing::internal::AnythingMatcher_const&,void>(&local_498,(AnythingMatcher *)&testing::_)
  ;
  anon_unknown.dwarf_16883::mock_file::gmock_lock
            (&local_428,(mock_file *)local_3c0,&local_440,&local_468,&local_480,&local_498);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
            ::operator()(&local_428,&local_499,(void *)0x0);
  this_01 = testing::internal::
            MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
            ::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                       ,0x13f,"file","lock (_, _, _, _)");
  testing::Return<bool>((testing *)&local_4d0,true);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_4c0,(ReturnAction *)&local_4d0);
  testing::internal::
  TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::WillOnce(this_01,&local_4c0);
  testing::
  Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::~Action(&local_4c0);
  testing::internal::ReturnAction<bool>::~ReturnAction(&local_4d0);
  testing::internal::
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::~MockSpec(&local_428);
  testing::Matcher<pstore::file::file_base::blocking_mode>::~Matcher(&local_498);
  testing::Matcher<pstore::file::file_base::lock_kind>::~Matcher(&local_480);
  testing::Matcher<unsigned_long>::~Matcher(&local_468);
  testing::Matcher<unsigned_long>::~Matcher(&local_440);
  testing::Matcher<unsigned_long>::Matcher<testing::internal::AnythingMatcher_const&,void>
            (&local_520,(AnythingMatcher *)&testing::_);
  testing::Matcher<unsigned_long>::Matcher<testing::internal::AnythingMatcher_const&,void>
            (&local_538,(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_16883::mock_file::gmock_unlock
            (&local_508,(mock_file *)local_3c0,&local_520,&local_538);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::operator()
                      (&local_508,(WithoutMatchers *)((long)&offset + 7),(void *)0x0);
  this_03 = testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                       ,0x140,"file","unlock (_, _)");
  testing::internal::TypedExpectation<void_(unsigned_long,_unsigned_long)>::Times(this_03,1);
  testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::~MockSpec(&local_508);
  testing::Matcher<unsigned_long>::~Matcher(&local_538);
  testing::Matcher<unsigned_long>::~Matcher(&local_520);
  lock.kind_ = 7;
  lock.locked_ = false;
  lock._29_3_ = 0;
  pstore::file::range_lock::range_lock
            ((range_lock *)local_570,(file_base *)local_3c0,5,7,exclusive_write);
  pstore::file::range_lock::lock((range_lock *)local_570);
  this_04 = (custom_exception *)__cxa_allocate_exception(8);
  *this_04 = (custom_exception)0x0;
  TestBody::custom_exception::custom_exception(this_04);
  __cxa_throw(this_04,&TestBody()::custom_exception::typeinfo,
              TestBody::custom_exception::~custom_exception);
}

Assistant:

TEST (RangeLock, ErrorWithLockHeld) {
    mock_file file;

    using ::testing::_;
    EXPECT_CALL (file, lock (_, _, _, _)).WillOnce (::testing::Return (true));
    EXPECT_CALL (file, unlock (_, _)).Times (1);

    class custom_exception : public std::exception {};

    try {
        constexpr auto offset = std::uint64_t{5};
        constexpr auto size = std::size_t{7};
        pstore::file::range_lock lock (&file, offset, size, mock_file::lock_kind::exclusive_write);
        lock.lock ();
        // Throw with the lock held.
        throw custom_exception{};
    } catch (custom_exception const &) {
    } catch (...) {
        GTEST_FAIL () << "An unexpected exception was raised.";
    }
}